

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O2

int TUPU::base64_decode(string *ascdata,void **buf_ptr,size_t *but_len)

{
  int len;
  int iVar1;
  char *__dest;
  size_t sVar2;
  void *data;
  BIO_METHOD *type;
  BIO *pBVar3;
  BIO *append;
  
  __dest = (char *)calloc(1,ascdata->_M_string_length + 1);
  strcpy(__dest,(ascdata->_M_dataplus)._M_p);
  sVar2 = calcDecodeLength(__dest);
  len = (int)sVar2;
  data = calloc(1,(long)(len + 1));
  type = BIO_f_base64();
  pBVar3 = BIO_new(type);
  append = BIO_new_mem_buf(__dest,-1);
  pBVar3 = BIO_push(pBVar3,append);
  BIO_set_flags(pBVar3,0x100);
  iVar1 = BIO_read(pBVar3,data,len);
  if ((long)len == (long)iVar1) {
    BIO_free_all(pBVar3);
    *buf_ptr = data;
    *but_len = (long)iVar1;
    free(__dest);
    return 0;
  }
  __assert_fail("len == (size_t)length",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuputech[P]tupu-cpp-sdk/src/Base64.cpp"
                ,0x58,"int TUPU::base64_decode(const string &, void **, size_t *)");
}

Assistant:

int TUPU::base64_decode(const string & ascdata, void **buf_ptr, size_t *but_len)
{
    BIO *bmem, *b64;

    size_t input_len = ascdata.size() + 1;
    char *input = (char *)malloc(input_len);
    memset(input, 0, input_len);
    strcpy(input, ascdata.c_str());

    int length = calcDecodeLength(input);
    unsigned char *buffer = (unsigned char*)malloc(length + 1);
    memset(buffer, 0, length + 1);

    b64 = BIO_new(BIO_f_base64());
    bmem = BIO_new_mem_buf(input, -1);
    b64 = BIO_push(b64, bmem);

    //Do not use newlines to flush buffer
    BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);

    size_t len = BIO_read(b64, buffer, length);
    assert(len == (size_t)length);
    //string result((char*)buffer, length);

    //free(buffer);
    BIO_free_all(b64);

    *buf_ptr = buffer;
    *but_len = length;

    free(input);

    return 0;
}